

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O2

bool Diligent::PipelineResourceSignaturesCompatible
               (PipelineResourceSignatureDesc *Desc0,PipelineResourceSignatureDesc *Desc1,
               bool IgnoreSamplerDescriptions)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  Uint32 s;
  
  if ((Desc0->BindingIndex == Desc1->BindingIndex) && (Desc0->NumResources == Desc1->NumResources))
  {
    uVar4 = 0xffffffffffffffff;
    lVar5 = 0;
    do {
      uVar4 = uVar4 + 1;
      if (Desc0->NumResources <= uVar4) {
        uVar3 = Desc0->NumImmutableSamplers;
        if (uVar3 != Desc1->NumImmutableSamplers) {
          return false;
        }
        lVar5 = 0x10;
        uVar4 = 0;
        while( true ) {
          bVar1 = uVar3 <= uVar4;
          if (bVar1) {
            return bVar1;
          }
          if (*(int *)((long)(Desc0->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x3c) !=
              *(int *)((long)(Desc1->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x3c)) break;
          if (!IgnoreSamplerDescriptions) {
            bVar2 = SamplerDesc::operator!=
                              ((SamplerDesc *)
                               ((long)(Desc0->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x2c),
                               (SamplerDesc *)
                               ((long)(Desc1->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x2c))
            ;
            if (bVar2) {
              return bVar1;
            }
            uVar3 = Desc0->NumImmutableSamplers;
          }
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x48;
        }
        return bVar1;
      }
      bVar1 = PipelineResourcesCompatible
                        ((PipelineResourceDesc *)((long)&Desc0->Resources->Name + lVar5),
                         (PipelineResourceDesc *)((long)&Desc1->Resources->Name + lVar5));
      lVar5 = lVar5 + 0x18;
    } while (bVar1);
  }
  return false;
}

Assistant:

bool PipelineResourceSignaturesCompatible(const PipelineResourceSignatureDesc& Desc0,
                                          const PipelineResourceSignatureDesc& Desc1,
                                          bool                                 IgnoreSamplerDescriptions) noexcept
{
    if (Desc0.BindingIndex != Desc1.BindingIndex)
        return false;

    if (Desc0.NumResources != Desc1.NumResources)
        return false;

    for (Uint32 r = 0; r < Desc0.NumResources; ++r)
    {
        if (!PipelineResourcesCompatible(Desc0.Resources[r], Desc1.Resources[r]))
            return false;
    }

    if (Desc0.NumImmutableSamplers != Desc1.NumImmutableSamplers)
        return false;

    for (Uint32 s = 0; s < Desc0.NumImmutableSamplers; ++s)
    {
        const ImmutableSamplerDesc& Samp0 = Desc0.ImmutableSamplers[s];
        const ImmutableSamplerDesc& Samp1 = Desc1.ImmutableSamplers[s];

        if (Samp0.ShaderStages != Samp1.ShaderStages)
            return false;

        if (!IgnoreSamplerDescriptions && Samp0.Desc != Samp1.Desc)
            return false;
    }

    return true;
}